

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

string * __thiscall
cppnet::Address::AsString_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ushort uVar3;
  pointer pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_2;
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  if (this->_address_type != AT_IPV6) {
    pcVar4 = (this->_ip)._M_dataplus._M_p;
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar4,pcVar4 + (this->_ip)._M_string_length);
    std::__cxx11::string::append((char *)&local_88);
    uVar3 = this->_port;
    uVar11 = 1;
    if (((9 < uVar3) && (uVar11 = 2, 99 < uVar3)) && (uVar11 = 3, 999 < uVar3)) {
      uVar11 = 5 - (uVar3 < 10000);
    }
    paVar2 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_68._M_dataplus._M_p,uVar11,(uint)uVar3);
    uVar8 = 0xf;
    if (local_88 != &local_78) {
      uVar8 = local_78._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_68._M_string_length + local_80) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        uVar8 = local_68.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_68._M_string_length + local_80) goto LAB_00113356;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
    }
    else {
LAB_00113356:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = puVar6 + 2;
    if ((size_type *)*puVar6 == psVar1) {
      uVar8 = puVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar6[1];
    *puVar6 = psVar1;
    puVar6[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    _Var10._M_p = (pointer)local_88;
    if (local_88 == &local_78) {
      return __return_storage_ptr__;
    }
    goto LAB_0011351a;
  }
  std::operator+(&local_68,"[",&this->_ip);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_78._M_allocated_capacity = *puVar7;
    local_78._8_8_ = plVar5[3];
    local_88 = &local_78;
  }
  else {
    local_78._M_allocated_capacity = *puVar7;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar3 = this->_port;
  uVar11 = 1;
  if (((9 < uVar3) && (uVar11 = 2, 99 < uVar3)) && (uVar11 = 3, 999 < uVar3)) {
    uVar11 = 5 - (uVar3 < 10000);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)uVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,uVar11,(uint)uVar3);
  uVar8 = 0xf;
  if (local_88 != &local_78) {
    uVar8 = local_78._M_allocated_capacity;
  }
  if ((ulong)uVar8 < (ulong)(local_40 + local_80)) {
    uVar9 = 0xf;
    if (local_48 != local_38) {
      uVar9 = local_38[0];
    }
    if (uVar9 < (ulong)(local_40 + local_80)) goto LAB_00113428;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00113428:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar8 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  _Var10._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
LAB_0011351a:
  operator_delete(_Var10._M_p);
  return __return_storage_ptr__;
}

Assistant:

const std::string Address::AsString() {
    if (_address_type == AT_IPV6) {
        return "[" + _ip + "]:" + std::to_string(_port);

    } else {
        return _ip + ":" + std::to_string(_port);
    }
}